

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarymodelserialiser.cpp
# Opt level: O0

bool __thiscall
BinaryModelSerialiserPrivate::readBinaryElement
          (BinaryModelSerialiserPrivate *this,QDataStream *source,QModelIndex *parent)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  QDataStream *this_00;
  bool bVar3;
  undefined1 local_88 [8];
  QModelIndex currIdx;
  int j;
  int local_60;
  bool local_59;
  int i;
  bool hasChild;
  QVariant tempData;
  int local_30;
  qint32 tempRole;
  qint32 colCount;
  qint32 rowCount;
  QModelIndex *parent_local;
  QDataStream *source_local;
  BinaryModelSerialiserPrivate *this_local;
  
  _colCount = parent;
  parent_local = (QModelIndex *)source;
  source_local = (QDataStream *)this;
  this_00 = (QDataStream *)QDataStream::operator>>(source,&tempRole);
  QDataStream::operator>>(this_00,&local_30);
  pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
  (**(code **)(*(long *)pQVar1 + 0xf8))(pQVar1,0,tempRole,_colCount);
  pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
  (**(code **)(*(long *)pQVar1 + 0x100))(pQVar1,0,local_30,_colCount);
  pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
  iVar2 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,_colCount);
  if (iVar2 == tempRole) {
    pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
    iVar2 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,_colCount);
    if (iVar2 == local_30) {
      tempData.d._28_4_ = 0xffffffff;
      ::QVariant::QVariant((QVariant *)&i);
      local_59 = false;
      local_60 = 0;
      while( true ) {
        bVar3 = false;
        if (local_60 < tempRole) {
          iVar2 = QDataStream::status();
          bVar3 = iVar2 == 0;
        }
        if (!bVar3) break;
        currIdx.m._0_4_ = 0;
        while( true ) {
          bVar3 = false;
          if ((int)currIdx.m < local_30) {
            iVar2 = QDataStream::status();
            bVar3 = iVar2 == 0;
          }
          if (!bVar3) break;
          pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
          (**(code **)(*(long *)pQVar1 + 0x60))(local_88,pQVar1,local_60,(int)currIdx.m,_colCount);
          QDataStream::operator>>((QDataStream *)parent_local,(int *)&tempData.d.field_0x1c);
          while( true ) {
            bVar3 = false;
            if (tempData.d._28_4_ != -1) {
              iVar2 = QDataStream::status();
              bVar3 = iVar2 == 0;
            }
            if (!bVar3) break;
            ::operator>>((QDataStream *)parent_local,(QVariant *)&i);
            iVar2 = QDataStream::status();
            if (iVar2 != 0) break;
            pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
            (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_88,&i,tempData.d._28_4_);
            QDataStream::operator>>((QDataStream *)parent_local,(int *)&tempData.d.field_0x1c);
          }
          iVar2 = QDataStream::status();
          if (iVar2 == 0) {
            QDataStream::operator>>((QDataStream *)parent_local,&local_59);
          }
          iVar2 = QDataStream::status();
          if (iVar2 != 0) break;
          if (((local_59 & 1U) != 0) &&
             (bVar3 = readBinaryElement(this,(QDataStream *)parent_local,(QModelIndex *)local_88),
             !bVar3)) {
            pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
            (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,0,tempRole,_colCount);
            pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
            (**(code **)(*(long *)pQVar1 + 0x110))(pQVar1,0,local_30,_colCount);
            this_local._7_1_ = 0;
            goto LAB_00131571;
          }
          currIdx.m._0_4_ = (int)currIdx.m + 1;
        }
        local_60 = local_60 + 1;
      }
      iVar2 = QDataStream::status();
      if (iVar2 == 0) {
        this_local._7_1_ = 1;
      }
      else {
        pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
        (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,0,tempRole,_colCount);
        pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
        (**(code **)(*(long *)pQVar1 + 0x110))(pQVar1,0,local_30,_colCount);
        this_local._7_1_ = 0;
      }
LAB_00131571:
      ::QVariant::~QVariant((QVariant *)&i);
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool BinaryModelSerialiserPrivate::readBinaryElement(QDataStream &source, const QModelIndex &parent)
{
    Q_ASSERT(m_model);
    qint32 rowCount, colCount;
    source >> rowCount >> colCount;
    m_model->insertRows(0, rowCount, parent);
    m_model->insertColumns(0, colCount, parent);
    if (m_model->rowCount(parent) != rowCount)
        return false;
    if (m_model->columnCount(parent) != colCount)
        return false;
    qint32 tempRole = -1;
    QVariant tempData;
    bool hasChild = false;
    for (int i = 0; i < rowCount && source.status() == QDataStream::Ok; ++i) {
        for (int j = 0; j < colCount && source.status() == QDataStream::Ok; ++j) {
            const QModelIndex currIdx = m_model->index(i, j, parent);
            for (source >> tempRole; tempRole != -1 && source.status() == QDataStream::Ok; source >> tempRole) {
                source >> tempData;
                if (source.status() != QDataStream::Ok)
                    break;
                m_model->setData(currIdx, tempData, tempRole);
            }
            if (source.status() == QDataStream::Ok)
                source >> hasChild;
            if (source.status() != QDataStream::Ok)
                break;
            if (hasChild) {
                if (!readBinaryElement(source, currIdx)) {
                    m_model->removeRows(0, rowCount, parent);
                    m_model->removeColumns(0, colCount, parent);
                    return false;
                }
            }
        }
    }
    if (source.status() != QDataStream::Ok) {
        m_model->removeRows(0, rowCount, parent);
        m_model->removeColumns(0, colCount, parent);
        return false;
    }
    return true;
}